

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgl.c
# Opt level: O2

int RunGLTest(int argc,char **argv,int logo,int logocursor,int slowly,int bpp,float gamma,
             int noframe,int fsaa,int sync,int accel)

{
  float (*pafVar1) [3];
  float (*pafVar2) [3];
  float (*pafVar3) [3];
  float (*pafVar4) [3];
  uint uVar5;
  FILE *pFVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  undefined8 *puVar14;
  float *pfVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  char **ppcVar19;
  int value;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  float color [8] [3];
  float cube [8] [3];
  SDL_Event event;
  
  uVar17 = (ulong)(uint)bpp;
  lVar12 = 0xc;
  lVar11 = lVar12;
  puVar14 = &DAT_00104490;
  pfVar15 = color[0];
  for (; lVar11 != 0; lVar11 = lVar11 + -1) {
    *(undefined8 *)pfVar15 = *puVar14;
    puVar14 = puVar14 + 1;
    pfVar15 = pfVar15 + 2;
  }
  puVar14 = &DAT_001044f0;
  pfVar15 = cube[0];
  for (; lVar12 != 0; lVar12 = lVar12 + -1) {
    *(undefined8 *)pfVar15 = *puVar14;
    puVar14 = puVar14 + 1;
    pfVar15 = pfVar15 + 2;
  }
  local_118 = logo;
  local_110 = logocursor;
  local_10c = slowly;
  iVar7 = SDL_Init(0x20);
  pFVar6 = _stderr;
  if (iVar7 < 0) {
    uVar9 = SDL_GetError();
    fprintf(pFVar6,"Couldn\'t initialize SDL: %s\n",uVar9);
  }
  else {
    if (bpp == 0) {
      lVar12 = SDL_GetVideoInfo();
      uVar17 = (ulong)((uint)(8 < *(byte *)(*(long *)(lVar12 + 8) + 8)) * 8 + 8);
    }
    uVar16 = (uint)(local_118 != 0 & USE_DEPRECATED_OPENGLBLIT) * 8 + 2;
    for (ppcVar19 = argv + 1; *ppcVar19 != (char *)0x0; ppcVar19 = ppcVar19 + 1) {
      iVar7 = strcmp(*ppcVar19,"-fullscreen");
      if (iVar7 == 0) {
        uVar16 = uVar16 | 0x80000000;
      }
    }
    uVar5 = uVar16 | 0x20;
    if (noframe == 0) {
      uVar5 = uVar16;
    }
    if ((int)uVar17 - 0xfU < 2) {
      uVar16 = 5;
      uVar18 = uVar16;
    }
    else if ((int)uVar17 == 8) {
      uVar16 = 2;
      uVar18 = 3;
    }
    else {
      uVar16 = 8;
      uVar18 = uVar16;
    }
    SDL_GL_SetAttribute(0,uVar18);
    SDL_GL_SetAttribute(1,uVar18);
    SDL_GL_SetAttribute(2,uVar16);
    SDL_GL_SetAttribute(6,0x10);
    SDL_GL_SetAttribute(5,1);
    if (fsaa != 0) {
      SDL_GL_SetAttribute(0xd,1);
      SDL_GL_SetAttribute(0xe,fsaa);
    }
    if (accel != 0) {
      SDL_GL_SetAttribute(0xf,1);
    }
    SDL_GL_SetAttribute(0x10,sync != 0);
    lVar12 = SDL_SetVideoMode(0x280,0x1e0,uVar17,uVar5);
    pFVar6 = _stderr;
    if (lVar12 != 0) {
      lVar12 = SDL_GetVideoSurface();
      printf("Screen BPP: %d\n",(ulong)*(byte *)(*(long *)(lVar12 + 8) + 8));
      putchar(10);
      uVar9 = glGetString(0x1f00);
      printf("Vendor     : %s\n",uVar9);
      uVar9 = glGetString(0x1f01);
      printf("Renderer   : %s\n",uVar9);
      uVar9 = glGetString(0x1f02);
      printf("Version    : %s\n",uVar9);
      uVar9 = glGetString(0x1f03);
      printf("Extensions : %s\n",uVar9);
      putchar(10);
      SDL_GL_GetAttribute(0,&value);
      printf("SDL_GL_RED_SIZE: requested %d, got %d\n",(ulong)uVar18,(ulong)(uint)value);
      SDL_GL_GetAttribute(1,&value);
      printf("SDL_GL_GREEN_SIZE: requested %d, got %d\n",(ulong)uVar18,(ulong)(uint)value);
      SDL_GL_GetAttribute(2,&value);
      printf("SDL_GL_BLUE_SIZE: requested %d, got %d\n",(ulong)uVar16,(ulong)(uint)value);
      SDL_GL_GetAttribute(6,&value);
      printf("SDL_GL_DEPTH_SIZE: requested %d, got %d\n",uVar17,(ulong)(uint)value);
      SDL_GL_GetAttribute(5,&value);
      printf("SDL_GL_DOUBLEBUFFER: requested 1, got %d\n",(ulong)(uint)value);
      if (fsaa != 0) {
        SDL_GL_GetAttribute(0xd,&value);
        printf("SDL_GL_MULTISAMPLEBUFFERS: requested 1, got %d\n",(ulong)(uint)value);
        SDL_GL_GetAttribute(0xe,&value);
        printf("SDL_GL_MULTISAMPLESAMPLES: requested %d, got %d\n",(ulong)(uint)fsaa,
               (ulong)(uint)value);
      }
      if (accel != 0) {
        SDL_GL_GetAttribute(0xf,&value);
        printf("SDL_GL_ACCELERATED_VISUAL: requested 1, got %d\n",(ulong)(uint)value);
      }
      if (sync != 0) {
        SDL_GL_GetAttribute(0x10,&value);
        printf("SDL_GL_SWAP_CONTROL: requested 1, got %d\n",(ulong)(uint)value);
      }
      SDL_WM_SetCaption("SDL GL test","testgl");
      if ((gamma != 0.0) || (NAN(gamma))) {
        SDL_SetGamma(gamma,gamma,gamma);
      }
      glViewport(0,0,0x280,0x1e0);
      glMatrixMode(0x1701);
      glLoadIdentity();
      glOrtho(0xc000000000000000,0x4000000000000000,0xc000000000000000,0,0xc034000000000000,
              0x4034000000000000);
      glMatrixMode(0x1700);
      glLoadIdentity();
      glEnable(0xb71);
      glDepthFunc(0x201);
      glShadeModel(0x1d01);
      local_114 = SDL_GetTicks();
      iVar7 = 0;
      iVar13 = 0;
      while (iVar7 == 0) {
        glClearColor(0,0,0,0x3f800000);
        glClear(0x4100);
        glBegin(7);
        glColor3fv(color);
        glVertex3fv(cube);
        glColor3fv(color + 1);
        glVertex3fv(cube + 1);
        glColor3fv(color + 2);
        glVertex3fv(cube + 2);
        glColor3fv(color + 3);
        glVertex3fv(cube + 3);
        glColor3fv(color + 3);
        glVertex3fv(cube + 3);
        glColor3fv(color + 4);
        glVertex3fv(cube + 4);
        glColor3fv(color + 7);
        glVertex3fv(cube + 7);
        glColor3fv(color + 2);
        glVertex3fv(cube + 2);
        glColor3fv(color);
        glVertex3fv(cube);
        pafVar1 = color + 5;
        glColor3fv(pafVar1);
        pafVar3 = cube + 5;
        glVertex3fv(pafVar3);
        pafVar2 = color + 6;
        glColor3fv(pafVar2);
        pafVar4 = cube + 6;
        glVertex3fv(pafVar4);
        glColor3fv(color + 1);
        glVertex3fv(cube + 1);
        glColor3fv(pafVar1);
        glVertex3fv(pafVar3);
        glColor3fv(color + 4);
        glVertex3fv(cube + 4);
        glColor3fv(color + 7);
        glVertex3fv(cube + 7);
        glColor3fv(pafVar2);
        glVertex3fv(pafVar4);
        glColor3fv(pafVar1);
        glVertex3fv(pafVar3);
        glColor3fv(color);
        glVertex3fv(cube);
        glColor3fv(color + 3);
        glVertex3fv(cube + 3);
        glColor3fv(color + 4);
        glVertex3fv(cube + 4);
        glColor3fv(pafVar2);
        glVertex3fv(pafVar4);
        glColor3fv(color + 1);
        glVertex3fv(cube + 1);
        glColor3fv(color + 2);
        glVertex3fv(cube + 2);
        glColor3fv(color + 7);
        glVertex3fv(cube + 7);
        glEnd();
        glMatrixMode(0x1700);
        glRotatef(0x40a00000,0x3f800000,0x3f800000,0x3f800000);
        if (local_118 != 0) {
          if (USE_DEPRECATED_OPENGLBLIT == 1) {
            DrawLogoBlit();
          }
          else {
            DrawLogoTexture();
          }
        }
        if (local_110 != 0) {
          DrawLogoCursor();
        }
        SDL_GL_SwapBuffers();
        uVar16 = glGetError();
        if (uVar16 != 0) {
          fprintf(_stderr,"testgl: OpenGL error: %d\n",(ulong)uVar16);
        }
        pcVar10 = (char *)SDL_GetError();
        if (*pcVar10 != '\0') {
          fprintf(_stderr,"testgl: SDL error \'%s\'\n",pcVar10);
          SDL_ClearError();
        }
        if (local_10c != 0) {
          SDL_Delay(0x14);
        }
        iVar7 = 0;
        while (iVar8 = SDL_PollEvent(&event), iVar8 != 0) {
          iVar7 = HandleEvent(&event);
        }
        iVar13 = iVar13 + 1;
      }
      iVar7 = SDL_GetTicks();
      if (iVar7 - local_114 != 0) {
        printf("%2.2f FPS\n",(double)((float)iVar13 / (float)(uint)(iVar7 - local_114)) * 1000.0);
      }
      if (global_image != (SDL_Surface *)0x0) {
        SDL_FreeSurface();
        global_image = (SDL_Surface *)0x0;
      }
      if (global_texture != 0) {
        glDeleteTextures(1,&global_texture);
        global_texture = 0;
      }
      if (cursor_texture != 0) {
        glDeleteTextures(1,&cursor_texture);
        cursor_texture = 0;
      }
      SDL_Quit();
      return 0;
    }
    uVar9 = SDL_GetError();
    fprintf(pFVar6,"Couldn\'t set GL mode: %s\n",uVar9);
    SDL_Quit();
  }
  exit(1);
}

Assistant:

int RunGLTest( int argc, char* argv[],
               int logo, int logocursor, int slowly, int bpp, float gamma, int noframe, int fsaa, int sync, int accel )
{
	int i;
	int rgb_size[3];
	int w = 640;
	int h = 480;
	int done = 0;
	int frames;
	Uint32 start_time, this_time;
        float color[8][3]= {{ 1.0,  1.0,  0.0}, 
			    { 1.0,  0.0,  0.0},
			    { 0.0,  0.0,  0.0},
			    { 0.0,  1.0,  0.0},
			    { 0.0,  1.0,  1.0},
			    { 1.0,  1.0,  1.0},
			    { 1.0,  0.0,  1.0},
			    { 0.0,  0.0,  1.0}};
	float cube[8][3]= {{ 0.5,  0.5, -0.5}, 
			   { 0.5, -0.5, -0.5},
			   {-0.5, -0.5, -0.5},
			   {-0.5,  0.5, -0.5},
			   {-0.5,  0.5,  0.5},
			   { 0.5,  0.5,  0.5},
			   { 0.5, -0.5,  0.5},
			   {-0.5, -0.5,  0.5}};
	Uint32 video_flags;
	int value;

	if( SDL_Init( SDL_INIT_VIDEO ) < 0 ) {
		fprintf(stderr,"Couldn't initialize SDL: %s\n",SDL_GetError());
		exit( 1 );
	}

	/* See if we should detect the display depth */
	if ( bpp == 0 ) {
		if ( SDL_GetVideoInfo()->vfmt->BitsPerPixel <= 8 ) {
			bpp = 8;
		} else {
			bpp = 16;  /* More doesn't seem to work */
		}
	}

	/* Set the flags we want to use for setting the video mode */
	if ( logo && USE_DEPRECATED_OPENGLBLIT ) {
		video_flags = SDL_OPENGLBLIT;
	} else {
		video_flags = SDL_OPENGL;
	}
	for ( i=1; argv[i]; ++i ) {
		if ( strcmp(argv[i], "-fullscreen") == 0 ) {
			video_flags |= SDL_FULLSCREEN;
		}
	}

        if (noframe) {
           video_flags |= SDL_NOFRAME;
        }

	/* Initialize the display */
	switch (bpp) {
	    case 8:
		rgb_size[0] = 3;
		rgb_size[1] = 3;
		rgb_size[2] = 2;
		break;
	    case 15:
	    case 16:
		rgb_size[0] = 5;
		rgb_size[1] = 5;
		rgb_size[2] = 5;
		break;
            default:
		rgb_size[0] = 8;
		rgb_size[1] = 8;
		rgb_size[2] = 8;
		break;
	}
	SDL_GL_SetAttribute( SDL_GL_RED_SIZE, rgb_size[0] );
	SDL_GL_SetAttribute( SDL_GL_GREEN_SIZE, rgb_size[1] );
	SDL_GL_SetAttribute( SDL_GL_BLUE_SIZE, rgb_size[2] );
	SDL_GL_SetAttribute( SDL_GL_DEPTH_SIZE, 16 );
	SDL_GL_SetAttribute( SDL_GL_DOUBLEBUFFER, 1 );
	if ( fsaa ) {
		SDL_GL_SetAttribute( SDL_GL_MULTISAMPLEBUFFERS, 1 );
		SDL_GL_SetAttribute( SDL_GL_MULTISAMPLESAMPLES, fsaa );
	}
	if ( accel ) {
		SDL_GL_SetAttribute( SDL_GL_ACCELERATED_VISUAL, 1 );
	}
	if ( sync ) {
		SDL_GL_SetAttribute( SDL_GL_SWAP_CONTROL, 1 );
	} else {
		SDL_GL_SetAttribute( SDL_GL_SWAP_CONTROL, 0 );
	}
	if ( SDL_SetVideoMode( w, h, bpp, video_flags ) == NULL ) {
		fprintf(stderr, "Couldn't set GL mode: %s\n", SDL_GetError());
		SDL_Quit();
		exit(1);
	}

	printf("Screen BPP: %d\n", SDL_GetVideoSurface()->format->BitsPerPixel);
	printf("\n");
	printf( "Vendor     : %s\n", glGetString( GL_VENDOR ) );
	printf( "Renderer   : %s\n", glGetString( GL_RENDERER ) );
	printf( "Version    : %s\n", glGetString( GL_VERSION ) );
	printf( "Extensions : %s\n", glGetString( GL_EXTENSIONS ) );
	printf("\n");

	SDL_GL_GetAttribute( SDL_GL_RED_SIZE, &value );
	printf( "SDL_GL_RED_SIZE: requested %d, got %d\n", rgb_size[0],value);
	SDL_GL_GetAttribute( SDL_GL_GREEN_SIZE, &value );
	printf( "SDL_GL_GREEN_SIZE: requested %d, got %d\n", rgb_size[1],value);
	SDL_GL_GetAttribute( SDL_GL_BLUE_SIZE, &value );
	printf( "SDL_GL_BLUE_SIZE: requested %d, got %d\n", rgb_size[2],value);
	SDL_GL_GetAttribute( SDL_GL_DEPTH_SIZE, &value );
	printf( "SDL_GL_DEPTH_SIZE: requested %d, got %d\n", bpp, value );
	SDL_GL_GetAttribute( SDL_GL_DOUBLEBUFFER, &value );
	printf( "SDL_GL_DOUBLEBUFFER: requested 1, got %d\n", value );
	if ( fsaa ) {
		SDL_GL_GetAttribute( SDL_GL_MULTISAMPLEBUFFERS, &value );
		printf("SDL_GL_MULTISAMPLEBUFFERS: requested 1, got %d\n", value );
		SDL_GL_GetAttribute( SDL_GL_MULTISAMPLESAMPLES, &value );
		printf("SDL_GL_MULTISAMPLESAMPLES: requested %d, got %d\n", fsaa, value );
	}
	if ( accel ) {
		SDL_GL_GetAttribute( SDL_GL_ACCELERATED_VISUAL, &value );
		printf( "SDL_GL_ACCELERATED_VISUAL: requested 1, got %d\n", value );
	}
	if ( sync ) {
		SDL_GL_GetAttribute( SDL_GL_SWAP_CONTROL, &value );
		printf( "SDL_GL_SWAP_CONTROL: requested 1, got %d\n", value );
	}

	/* Set the window manager title bar */
	SDL_WM_SetCaption( "SDL GL test", "testgl" );

	/* Set the gamma for the window */
	if ( gamma != 0.0 ) {
		SDL_SetGamma(gamma, gamma, gamma);
	}

	glViewport( 0, 0, w, h );
	glMatrixMode( GL_PROJECTION );
	glLoadIdentity( );

	glOrtho( -2.0, 2.0, -2.0, 2.0, -20.0, 20.0 );

	glMatrixMode( GL_MODELVIEW );
	glLoadIdentity( );

	glEnable(GL_DEPTH_TEST);

	glDepthFunc(GL_LESS);

	glShadeModel(GL_SMOOTH);

	/* Loop until done. */
	start_time = SDL_GetTicks();
	frames = 0;
	while( !done ) {
		GLenum gl_error;
		char* sdl_error;
		SDL_Event event;

		/* Do our drawing, too. */
		glClearColor( 0.0, 0.0, 0.0, 1.0 );
		glClear( GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

		glBegin( GL_QUADS );

#ifdef SHADED_CUBE
			glColor3fv(color[0]);
			glVertex3fv(cube[0]);
			glColor3fv(color[1]);
			glVertex3fv(cube[1]);
			glColor3fv(color[2]);
			glVertex3fv(cube[2]);
			glColor3fv(color[3]);
			glVertex3fv(cube[3]);
			
			glColor3fv(color[3]);
			glVertex3fv(cube[3]);
			glColor3fv(color[4]);
			glVertex3fv(cube[4]);
			glColor3fv(color[7]);
			glVertex3fv(cube[7]);
			glColor3fv(color[2]);
			glVertex3fv(cube[2]);
			
			glColor3fv(color[0]);
			glVertex3fv(cube[0]);
			glColor3fv(color[5]);
			glVertex3fv(cube[5]);
			glColor3fv(color[6]);
			glVertex3fv(cube[6]);
			glColor3fv(color[1]);
			glVertex3fv(cube[1]);
			
			glColor3fv(color[5]);
			glVertex3fv(cube[5]);
			glColor3fv(color[4]);
			glVertex3fv(cube[4]);
			glColor3fv(color[7]);
			glVertex3fv(cube[7]);
			glColor3fv(color[6]);
			glVertex3fv(cube[6]);

			glColor3fv(color[5]);
			glVertex3fv(cube[5]);
			glColor3fv(color[0]);
			glVertex3fv(cube[0]);
			glColor3fv(color[3]);
			glVertex3fv(cube[3]);
			glColor3fv(color[4]);
			glVertex3fv(cube[4]);

			glColor3fv(color[6]);
			glVertex3fv(cube[6]);
			glColor3fv(color[1]);
			glVertex3fv(cube[1]);
			glColor3fv(color[2]);
			glVertex3fv(cube[2]);
			glColor3fv(color[7]);
			glVertex3fv(cube[7]);
#else /* flat cube */
			glColor3f(1.0, 0.0, 0.0);
			glVertex3fv(cube[0]);
			glVertex3fv(cube[1]);
			glVertex3fv(cube[2]);
			glVertex3fv(cube[3]);
			
			glColor3f(0.0, 1.0, 0.0);
			glVertex3fv(cube[3]);
			glVertex3fv(cube[4]);
			glVertex3fv(cube[7]);
			glVertex3fv(cube[2]);
			
			glColor3f(0.0, 0.0, 1.0);
			glVertex3fv(cube[0]);
			glVertex3fv(cube[5]);
			glVertex3fv(cube[6]);
			glVertex3fv(cube[1]);
			
			glColor3f(0.0, 1.0, 1.0);
			glVertex3fv(cube[5]);
			glVertex3fv(cube[4]);
			glVertex3fv(cube[7]);
			glVertex3fv(cube[6]);

			glColor3f(1.0, 1.0, 0.0);
			glVertex3fv(cube[5]);
			glVertex3fv(cube[0]);
			glVertex3fv(cube[3]);
			glVertex3fv(cube[4]);

			glColor3f(1.0, 0.0, 1.0);
			glVertex3fv(cube[6]);
			glVertex3fv(cube[1]);
			glVertex3fv(cube[2]);
			glVertex3fv(cube[7]);
#endif /* SHADED_CUBE */

		glEnd( );
		
		glMatrixMode(GL_MODELVIEW);
		glRotatef(5.0, 1.0, 1.0, 1.0);

		/* Draw 2D logo onto the 3D display */
		if ( logo ) {
			if ( USE_DEPRECATED_OPENGLBLIT ) {
				DrawLogoBlit();
			} else {
				DrawLogoTexture();
			}
		}
		if ( logocursor ) {
			DrawLogoCursor();
		}

		SDL_GL_SwapBuffers( );

		/* Check for error conditions. */
		gl_error = glGetError( );

		if( gl_error != GL_NO_ERROR ) {
			fprintf( stderr, "testgl: OpenGL error: %d\n", gl_error );
		}

		sdl_error = SDL_GetError( );

		if( sdl_error[0] != '\0' ) {
			fprintf(stderr, "testgl: SDL error '%s'\n", sdl_error);
			SDL_ClearError();
		}

		/* Allow the user to see what's happening */
		if ( slowly ) {
			SDL_Delay( 20 );
		}

		/* Check if there's a pending event. */
		while( SDL_PollEvent( &event ) ) {
			done = HandleEvent(&event);
		}
		++frames;
	}

	/* Print out the frames per second */
	this_time = SDL_GetTicks();
	if ( this_time != start_time ) {
		printf("%2.2f FPS\n",
			((float)frames/(this_time-start_time))*1000.0);
	}

	if ( global_image ) {
	   	SDL_FreeSurface(global_image);
		global_image = NULL;
	}
	if ( global_texture ) {
		glDeleteTextures( 1, &global_texture );
		global_texture = 0;
	}
	if ( cursor_texture ) {
		glDeleteTextures( 1, &cursor_texture );
		cursor_texture = 0;
	}

	/* Destroy our GL context, etc. */
	SDL_Quit( );
	return(0);
}